

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O0

QRhi * __thiscall QWidgetPrivate::rhi(QWidgetPrivate *this)

{
  QBackingStore *pQVar1;
  QWindow *pQVar2;
  QRhi *pQVar3;
  QWidgetPrivate *in_RDI;
  QWindow *window;
  QBackingStore *backingStore;
  QWidget *q;
  QWidget *in_stack_ffffffffffffffd8;
  WindowHandleMode mode;
  QWidgetPrivate *in_stack_fffffffffffffff8;
  
  q_func(in_RDI);
  mode = (WindowHandleMode)((ulong)in_RDI >> 0x20);
  pQVar1 = QWidget::backingStore(in_stack_ffffffffffffffd8);
  if (pQVar1 == (QBackingStore *)0x0) {
    pQVar3 = (QRhi *)0x0;
  }
  else {
    windowHandle(in_stack_fffffffffffffff8,mode);
    pQVar2 = (QWindow *)QBackingStore::handle();
    pQVar3 = (QRhi *)QPlatformBackingStore::rhi(pQVar2);
  }
  return pQVar3;
}

Assistant:

QRhi *QWidgetPrivate::rhi() const
{
    Q_Q(const QWidget);
    if (auto *backingStore = q->backingStore()) {
        auto *window = windowHandle(WindowHandleMode::Closest);
        return backingStore->handle()->rhi(window);
    } else {
        return nullptr;
    }
}